

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgi_acceptor.h
# Opt level: O1

void __thiscall
cppcms::impl::cgi::
socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
::socket_acceptor(socket_acceptor<cppcms::impl::cgi::scgi,_cppcms::impl::cgi::server_api_factory<cppcms::impl::cgi::scgi>_>
                  *this,service *srv,string *ip,int port,int backlog)

{
  acceptor *this_00;
  undefined4 uVar1;
  io_service *piVar2;
  endpoint ep;
  endpoint local_30 [8];
  
  (this->super_acceptor)._vptr_acceptor = (_func_int **)&PTR_async_accept_0028dac8;
  this->srv_ = srv;
  (this->api_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->api_).super___shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  piVar2 = cppcms::service::get_io_service(srv);
  this_00 = &this->acceptor_;
  booster::aio::acceptor::acceptor(this_00,piVar2);
  this->stopped_ = false;
  this->tcp_ = true;
  this->sndbuf_ = -1;
  this->rcvbuf_ = -1;
  booster::aio::endpoint::endpoint(local_30,(string *)ip,port);
  uVar1 = booster::aio::endpoint::family();
  booster::aio::acceptor::open(this_00,uVar1);
  booster::aio::basic_socket::set_option(this_00,2,1);
  booster::aio::acceptor::bind((endpoint *)this_00);
  booster::aio::acceptor::listen((int)this_00);
  booster::aio::endpoint::~endpoint(local_30);
  return;
}

Assistant:

socket_acceptor(cppcms::service &srv,std::string ip,int port,int backlog) :
				srv_(srv),
				acceptor_(srv_.get_io_service()),
				stopped_(false),
				tcp_(true),
				sndbuf_(-1),
				rcvbuf_(-1)
			{
				io::endpoint ep(ip,port);
				acceptor_.open(ep.family());
                #ifndef CPPCMS_WIN32
				acceptor_.set_option(io::basic_socket::reuse_address,true);
                #endif
				acceptor_.bind(ep);
				acceptor_.listen(backlog);
			}